

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseBody(TidyDocImpl *doc,Node *body,GetTokenMode mode)

{
  Node **ppNVar1;
  TidyTagId TVar2;
  Lexer *pLVar3;
  TidyParserMemory *pTVar4;
  TidyParserMemory data;
  Bool BVar5;
  int iVar6;
  long lVar7;
  Node *node;
  Dict *pDVar8;
  uint uVar9;
  Dict *pDVar10;
  Node **ppNVar11;
  undefined4 uVar12;
  TidyTagId id;
  uint vers;
  Node *pNVar13;
  GetTokenMode mode_00;
  bool bVar14;
  int local_70;
  uint local_6c;
  undefined8 uStack_40;
  
  pLVar3 = doc->lexer;
  if (body == (Node *)0x0) {
    iVar6 = (doc->stack).top;
    lVar7 = (long)iVar6;
    if (-1 < lVar7) {
      pTVar4 = (doc->stack).content;
      body = pTVar4[lVar7].original_node;
      mode_00 = pTVar4[lVar7].mode;
      local_70 = pTVar4[lVar7].register_1;
      local_6c = pTVar4[lVar7].register_2;
      (doc->stack).top = iVar6 + -1;
      goto LAB_0013b589;
    }
    body = (Node *)0x0;
    local_70 = 0;
  }
  else {
    prvTidyBumpObject(doc,body->parent);
    local_70 = 1;
  }
  mode_00 = IgnoreWhitespace;
  local_6c = 0;
LAB_0013b589:
  node = prvTidyGetToken(doc,mode_00);
  if (node != (Node *)0x0) {
    ppNVar1 = &body->content;
    do {
      pDVar8 = node->tag;
      pDVar10 = body->tag;
      if ((pDVar8 == pDVar10) && (node->type == StartTag)) {
LAB_0013b5e0:
        prvTidyReport(doc,body,node,0x235);
LAB_0013b5f5:
        prvTidyFreeNode(doc,node);
      }
      else {
        if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == TidyTag_HTML)) {
          BVar5 = prvTidynodeIsElement(node);
          if ((BVar5 != no) || (pLVar3->seenEndHtml != no)) goto LAB_0013b5e0;
          pLVar3->seenEndHtml = yes;
          goto LAB_0013b5f5;
        }
        if ((pLVar3->seenEndBody != no) && (node->type - StartTag < 3)) {
          prvTidyReport(doc,body,node,0x233);
          pDVar8 = node->tag;
          pDVar10 = body->tag;
        }
        if ((pDVar8 == pDVar10) && (node->type == EndTag)) {
          body->closed = yes;
          TrimSpaces(doc,body);
          prvTidyFreeNode(doc,node);
          pLVar3->seenEndBody = yes;
          mode_00 = IgnoreWhitespace;
          if ((body->parent != (Node *)0x0) &&
             ((pDVar8 = body->parent->tag, pDVar8 != (Dict *)0x0 &&
              (mode_00 = IgnoreWhitespace, pDVar8->id == TidyTag_NOFRAMES)))) {
            return (Node *)0x0;
          }
        }
        else {
          if (pDVar8 != (Dict *)0x0) {
            if (pDVar8->id - TidyTag_FRAME < 2) {
LAB_0013b6a3:
              if (((body->parent != (Node *)0x0) &&
                  (pDVar8 = body->parent->tag, pDVar8 != (Dict *)0x0)) &&
                 (pDVar8->id == TidyTag_NOFRAMES)) {
                TrimSpaces(doc,body);
                goto LAB_0013bab8;
              }
            }
            else if (pDVar8->id == TidyTag_NOFRAMES) {
              if (node->type == EndTag) goto LAB_0013b6a3;
              if (node->type == StartTag) {
                node->parent = body;
                pNVar13 = body->last;
                node->prev = pNVar13;
                ppNVar11 = &pNVar13->next;
                if (pNVar13 == (Node *)0x0) {
                  ppNVar11 = ppNVar1;
                }
                *ppNVar11 = node;
                body->last = node;
                uStack_40 = CONCAT44(local_70,mode_00);
                goto LAB_0013bbc1;
              }
            }
          }
          BVar5 = prvTidynodeIsText(node);
          if (BVar5 == no) {
            bVar14 = false;
            local_6c = 0;
          }
          else {
            bVar14 = false;
            local_6c = 0;
            if (node->end <= node->start + 1) {
              bVar14 = pLVar3->lexbuf[node->start] == ' ';
              local_6c = (uint)bVar14;
            }
          }
          pNVar13 = node;
          BVar5 = InsertMisc(body,node);
          id = (TidyTagId)pNVar13;
          if (BVar5 == no) {
            BVar5 = prvTidynodeIsText(node);
            if (BVar5 == no) {
              if (node->type == DocTypeTag) {
                InsertDocType(doc,body,node);
                goto LAB_0013b728;
              }
              if ((node->tag == (Dict *)0x0) || (TVar2 = node->tag->id, TVar2 == TidyTag_PARAM))
              goto LAB_0013b5e0;
              pLVar3->excludeBlocks = no;
              if (TVar2 != TidyTag_INPUT) {
                id = TidyTag_B;
                BVar5 = prvTidynodeHasCM(node,8);
                if (BVar5 == no) {
                  id = TidyTag_BODY;
                  BVar5 = prvTidynodeHasCM(node,0x10);
                  if (BVar5 == no) goto LAB_0013b807;
                }
LAB_0013b854:
                pDVar8 = node->tag;
                if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == TidyTag_LI)) goto LAB_0013b86b;
LAB_0013b960:
                if (node->type == EndTag) {
                  if (node->tag == (Dict *)0x0) {
LAB_0013b989:
                    id = TidyTag_BODY;
                    BVar5 = prvTidynodeHasCM(node,0x10);
                    if (BVar5 != no) {
                      pNVar13 = node;
                      prvTidyPopInline(doc,node);
                      id = (TidyTagId)pNVar13;
                    }
                  }
                  else {
                    TVar2 = node->tag->id;
                    if (TVar2 == TidyTag_P) {
                      node->type = StartEndTag;
                      node->implicit = yes;
                    }
                    else {
                      if (TVar2 != TidyTag_BR) goto LAB_0013b989;
                      node->type = StartTag;
                    }
                  }
                }
                BVar5 = prvTidynodeIsElement(node);
                if (BVar5 != no) {
                  if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_MAIN)) ||
                     (BVar5 = findNodeWithId((doc->root).content,id), BVar5 == no)) {
                    BVar5 = prvTidynodeHasCM(node,0x10);
                    if (BVar5 == no) {
                      local_70 = 1;
                      uVar12 = 0;
                    }
                    else {
                      if ((node->tag == (Dict *)0x0) ||
                         (vers = 0xfffffedb, node->tag->id != TidyTag_IMG)) {
                        vers = 0xfffffeda;
                      }
                      prvTidyConstrainVersion(doc,vers);
                      uVar12 = 1;
                      if (local_70 == 0) {
                        local_70 = 0;
                      }
                      else if (node->implicit == no) {
                        iVar6 = prvTidyInlineDup(doc,node);
                        local_70 = 0;
                        if (0 < iVar6) goto LAB_0013ba5c;
                      }
                    }
                    if (node->implicit != no) {
                      prvTidyReport(doc,body,node,0x247);
                    }
                    node->parent = body;
                    pNVar13 = body->last;
                    node->prev = pNVar13;
                    ppNVar11 = &pNVar13->next;
                    if (pNVar13 == (Node *)0x0) {
                      ppNVar11 = ppNVar1;
                    }
                    *ppNVar11 = node;
                    body->last = node;
                    uStack_40 = CONCAT44(local_70,uVar12);
LAB_0013bbc1:
                    data.original_node = body;
                    data.identity = prvTidyParseBody;
                    data.reentry_node = node;
                    data.reentry_mode = IgnoreWhitespace;
                    data.reentry_state = 0;
                    data.mode = (undefined4)uStack_40;
                    data.register_1 = uStack_40._4_4_;
                    data.register_2 = local_6c;
                    data._44_4_ = 0;
                    prvTidypushMemory(doc,data);
                    return node;
                  }
                  *(byte *)&doc->badForm = (byte)doc->badForm | 2;
                }
                goto LAB_0013b5e0;
              }
LAB_0013b807:
              BVar5 = prvTidyIsHTML5Mode(doc);
              if (BVar5 != no) goto LAB_0013b854;
              pDVar8 = node->tag;
LAB_0013b86b:
              uVar9 = pDVar8->model;
              if ((uVar9 & 4) == 0) {
                pNVar13 = body;
                prvTidyReport(doc,body,node,0x27e);
                id = (TidyTagId)pNVar13;
                pDVar8 = node->tag;
                uVar9 = pDVar8->model;
              }
              if ((uVar9 & 2) == 0) {
                if ((uVar9 & 4) != 0) {
                  MoveToHead(doc,body,node);
                  goto LAB_0013b728;
                }
                if ((uVar9 & 0x20) == 0) {
                  if ((uVar9 & 0x40) == 0) {
                    if ((uVar9 & 0x380) == 0) {
                      if (pDVar8->id != TidyTag_INPUT) {
                        BVar5 = prvTidynodeHasCM(node,0x600);
                        if (BVar5 == no) {
LAB_0013bab8:
                          prvTidyUngetToken(doc);
                          return (Node *)0x0;
                        }
                        goto LAB_0013b5f5;
                      }
                      prvTidyUngetToken(doc);
                      id = TidyTag_FORM;
                    }
                    else {
                      if (node->type == EndTag) goto LAB_0013b958;
                      prvTidyUngetToken(doc);
                      id = TidyTag_TABLE;
                    }
                  }
                  else {
                    prvTidyUngetToken(doc);
                    id = TidyTag_DL;
                  }
                  node = prvTidyInferredTag(doc,id);
                }
                else {
                  prvTidyUngetToken(doc);
                  node = prvTidyInferredTag(doc,TidyTag_UL);
                  pNVar13 = node;
                  AddClassNoIndent(doc,node);
                  id = (TidyTagId)pNVar13;
                }
LAB_0013b958:
                pLVar3->excludeBlocks = yes;
                goto LAB_0013b960;
              }
              if (((pDVar8->id == TidyTag_BODY) && (body->implicit != no)) &&
                 (body->attributes == (AttVal *)0x0)) {
                body->attributes = node->attributes;
                node->attributes = (AttVal *)0x0;
              }
              goto LAB_0013b5f5;
            }
            if ((bool)(bVar14 ^ 1) || mode_00 != IgnoreWhitespace) {
              prvTidyConstrainVersion(doc,0xfffffeda);
              if ((local_70 == 0) || (iVar6 = prvTidyInlineDup(doc,node), iVar6 < 1)) {
                node->parent = body;
                pNVar13 = body->last;
                node->prev = pNVar13;
                ppNVar11 = &pNVar13->next;
                if (pNVar13 == (Node *)0x0) {
                  ppNVar11 = ppNVar1;
                }
                *ppNVar11 = node;
                body->last = node;
                local_70 = 0;
                mode_00 = MixedContent;
              }
              else {
LAB_0013ba5c:
                local_70 = 0;
              }
            }
            else {
              prvTidyFreeNode(doc,node);
              local_6c = 1;
              mode_00 = IgnoreWhitespace;
            }
          }
        }
      }
LAB_0013b728:
      node = prvTidyGetToken(doc,mode_00);
    } while (node != (Node *)0x0);
  }
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseBody)( TidyDocImpl* doc, Node *body, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool checkstack = no;
    Bool iswhitenode = no;
    DEBUG_LOG_COUNTERS;

    mode = IgnoreWhitespace;
    checkstack = yes;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( body == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        body = memory.original_node;
        checkstack = memory.register_1;
        iswhitenode = memory.register_2;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(body);
        TY_(BumpObject)( doc, body->parent );
    }
    
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);
        /* find and discard multiple <body> elements */
        if (node->tag == body->tag && node->type == StartTag)
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* #538536 Extra endtags not detected */
        if ( nodeIsHTML(node) )
        {
            if (TY_(nodeIsElement)(node) || lexer->seenEndHtml)
                TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            else
                lexer->seenEndHtml = 1;

            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( lexer->seenEndBody &&
             ( node->type == StartTag ||
               node->type == EndTag   ||
               node->type == StartEndTag ) )
        {
            TY_(Report)(doc, body, node, CONTENT_AFTER_BODY );
        }

        if ( node->tag == body->tag && node->type == EndTag )
        {
            body->closed = yes;
            TrimSpaces(doc, body);
            TY_(FreeNode)( doc, node);
            lexer->seenEndBody = 1;
            DEBUG_LOG_GET_OLD_MODE;
            mode = IgnoreWhitespace;
            DEBUG_LOG_CHANGE_MODE;

            if ( nodeIsNOFRAMES(body->parent) )
                break;

            continue;
        }

        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type == StartTag)
            {
                TidyParserMemory memory = {0};

                TY_(InsertNodeAtEnd)(body, node);
                
                memory.identity = TY_(ParseBody);
                memory.original_node = body;
                memory.reentry_node = node;
                memory.register_1 = checkstack;
                memory.register_2 = iswhitenode;
                memory.mode = mode;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            }

            if (node->type == EndTag && nodeIsNOFRAMES(body->parent) )
            {
                TrimSpaces(doc, body);
                TY_(UngetToken)( doc );
                break;
            }
        }

        if ( (nodeIsFRAME(node) || nodeIsFRAMESET(node))
             && nodeIsNOFRAMES(body->parent) )
        {
            TrimSpaces(doc, body);
            TY_(UngetToken)( doc );
            break;
        }

        iswhitenode = no;

        if ( TY_(nodeIsText)(node) &&
             node->end <= node->start + 1 &&
             lexer->lexbuf[node->start] == ' ' )
            iswhitenode = yes;

        /* deal with comments etc. */
        if (InsertMisc(body, node))
            continue;

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if (iswhitenode && mode == IgnoreWhitespace)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* HTML 2 and HTML4 strict don't allow text here */
            TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT | VERS_HTML20));

            if (checkstack)
            {
                checkstack = no;

                if ( TY_(InlineDup)(doc, node) > 0 )
                    continue;
            }

            TY_(InsertNodeAtEnd)(body, node);
            DEBUG_LOG_GET_OLD_MODE;
            mode = MixedContent;
            DEBUG_LOG_CHANGE_MODE;
            continue;
        }

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, body, node);
            continue;
        }
        /* discard unknown  and PARAM tags */
        if ( node->tag == NULL || nodeIsPARAM(node) )
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          Netscape allows LI and DD directly in BODY
          We infer UL or DL respectively and use this
          Bool to exclude block-level elements so as
          to match Netscape's observed behaviour.
        */
        lexer->excludeBlocks = no;

        if ((( nodeIsINPUT(node) ||
             (!TY_(nodeHasCM)(node, CM_BLOCK) && !TY_(nodeHasCM)(node, CM_INLINE))
           ) && !TY_(IsHTML5Mode)(doc)) || nodeIsLI(node) )
        {
            /* avoid this error message being issued twice */
            if (!(node->tag->model & CM_HEAD))
                TY_(Report)(doc, body, node, TAG_NOT_ALLOWED_IN);

            if (node->tag->model & CM_HTML)
            {
                /* copy body attributes if current body was inferred */
                if ( nodeIsBODY(node) && body->implicit
                     && body->attributes == NULL )
                {
                    body->attributes = node->attributes;
                    node->attributes = NULL;
                }

                TY_(FreeNode)( doc, node);
                continue;
            }

            if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, body, node);
                continue;
            }

            if (node->tag->model & CM_LIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_UL);
                AddClassNoIndent(doc, node);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & CM_DEFLIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_DL);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & (CM_TABLE | CM_ROWGRP | CM_ROW))
            {
                /* http://tidy.sf.net/issue/2855621 */
                if (node->type != EndTag) {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                lexer->excludeBlocks = yes;
            }
            else if ( nodeIsINPUT(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_FORM);
                lexer->excludeBlocks = yes;
            }
            else
            {
                if ( !TY_(nodeHasCM)(node, CM_ROW | CM_FIELD) )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* ignore </td> </th> <option> etc. */
                TY_(FreeNode)( doc, node );
                continue;
            }
        }

        if (node->type == EndTag)
        {
            if ( nodeIsBR(node) )
            {
                node->type = StartTag;
            }
            else if ( nodeIsP(node) )
            {
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if ( TY_(nodeHasCM)(node, CM_INLINE) )
                TY_(PopInline)( doc, node );
        }

        if (TY_(nodeIsElement)(node))
        {
            if (nodeIsMAIN(node))
            {
                /*\ Issue #166 - repeated <main> element
                 *  How to efficiently search for a previous main element?
                \*/
                if ( findNodeById(doc, TidyTag_MAIN) )
                {
                    doc->badForm |= flg_BadMain; /* this is an ERROR in format */
                    TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }
            }
            /* Issue #20 - merging from Ger Hobbelt fork put back CM_MIXED, which had been
               removed to fix this issue - reverting to fix 880221e
             */
            if ( TY_(nodeHasCM)(node, CM_INLINE) )
            {
                /* HTML4 strict doesn't allow inline content here */
                /* but HTML2 does allow img elements as children of body */
                if ( nodeIsIMG(node) )
                    TY_(ConstrainVersion)(doc, ~VERS_HTML40_STRICT);
                else
                    TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT|VERS_HTML20));

                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }
                
                DEBUG_LOG_GET_OLD_MODE;
                mode = MixedContent;
                DEBUG_LOG_CHANGE_MODE;
            }
            else
            {
                checkstack = yes;
                DEBUG_LOG_GET_OLD_MODE;
                mode = IgnoreWhitespace;
                DEBUG_LOG_CHANGE_MODE;
            }

            if (node->implicit)
            {
                TY_(Report)(doc, body, node, INSERTING_TAG);
            }

            TY_(InsertNodeAtEnd)(body, node);
            
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseBody);
                memory.original_node = body;
                memory.reentry_node = node;
                memory.register_1 = checkstack;
                memory.register_2 = iswhitenode;
                memory.mode = mode;
                TY_(pushMemory)( doc, memory );
            }
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}